

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-thread.c
# Opt level: O3

void thread_check_stack(void *arg)

{
  code **ppcVar1;
  int iVar2;
  pthread_t __th;
  long lVar3;
  undefined8 extraout_RDX;
  long *plVar4;
  code **ppcVar5;
  long *plVar6;
  int64_t eval_b_1;
  int64_t eval_b_2;
  size_t stack_size;
  rlimit lim;
  pthread_attr_t attr;
  long lStack_e0;
  code *pcStack_d8;
  undefined8 uStack_c8;
  code *apcStack_c0 [2];
  undefined8 uStack_b0;
  code *apcStack_a8 [2];
  undefined8 uStack_98;
  long lStack_90;
  undefined1 auStack_88 [8];
  undefined4 auStack_80 [2];
  long lStack_78;
  code *pcStack_70;
  size_t local_68;
  rlim64_t local_60;
  size_t local_58;
  rlimit64 local_50;
  pthread_attr_t local_40;
  
  pcStack_70 = (code *)0x1d2e7a;
  iVar2 = getrlimit64(RLIMIT_STACK,&local_50);
  local_40.__align = (long)iVar2;
  local_58 = 0;
  if (local_40.__align == 0) {
    if (local_50.rlim_cur == 0xffffffffffffffff) {
      local_50.rlim_cur = 0x200000;
    }
    pcStack_70 = (code *)0x1d2eb0;
    __th = pthread_self();
    pcStack_70 = (code *)0x1d2ebd;
    iVar2 = pthread_getattr_np(__th,&local_40);
    local_58 = (size_t)iVar2;
    local_68 = 0;
    if (local_58 != 0) goto LAB_001d2f69;
    pcStack_70 = (code *)0x1d2eea;
    iVar2 = pthread_attr_getstacksize(&local_40,&local_58);
    local_68 = (size_t)iVar2;
    local_60 = 0;
    if (local_68 != 0) goto LAB_001d2f76;
    if ((arg == (void *)0x0) ||
       (local_60 = *(rlim64_t *)((long)arg + 8), *(rlim64_t *)((long)arg + 8) == 0)) {
      local_60 = local_50.rlim_cur;
    }
    local_68 = local_58;
    if ((long)local_58 < (long)local_60) goto LAB_001d2f83;
    pcStack_70 = (code *)0x1d2f3a;
    iVar2 = pthread_attr_destroy(&local_40);
    local_68 = (size_t)iVar2;
    local_60 = 0;
    if (local_68 == 0) {
      return;
    }
  }
  else {
    pcStack_70 = (code *)0x1d2f69;
    thread_check_stack_cold_1();
LAB_001d2f69:
    pcStack_70 = (code *)0x1d2f76;
    thread_check_stack_cold_2();
LAB_001d2f76:
    pcStack_70 = (code *)0x1d2f83;
    thread_check_stack_cold_3();
LAB_001d2f83:
    pcStack_70 = (code *)0x1d2f90;
    thread_check_stack_cold_5();
  }
  pcStack_70 = run_test_thread_stack_size_explicit;
  thread_check_stack_cold_4();
  auStack_80[0] = 1;
  lStack_78 = 0x100000;
  apcStack_a8[0] = (code *)0x1d2fc9;
  pcStack_70 = (code *)arg;
  iVar2 = uv_thread_create_ex(auStack_88,auStack_80,thread_check_stack);
  lStack_90 = (long)iVar2;
  uStack_98 = 0;
  if (lStack_90 == 0) {
    apcStack_a8[0] = (code *)0x1d2ff3;
    iVar2 = uv_thread_join(auStack_88);
    lStack_90 = (long)iVar2;
    uStack_98 = 0;
    if (lStack_90 != 0) goto LAB_001d32c7;
    lStack_78 = 0x800000;
    apcStack_a8[0] = (code *)0x1d3034;
    iVar2 = uv_thread_create_ex(auStack_88,auStack_80,thread_check_stack);
    lStack_90 = (long)iVar2;
    uStack_98 = 0;
    if (lStack_90 != 0) goto LAB_001d32d6;
    apcStack_a8[0] = (code *)0x1d305e;
    iVar2 = uv_thread_join(auStack_88);
    lStack_90 = (long)iVar2;
    uStack_98 = 0;
    if (lStack_90 != 0) goto LAB_001d32e5;
    arg = (void *)0x0;
    lStack_78 = 0;
    apcStack_a8[0] = (code *)0x1d309d;
    iVar2 = uv_thread_create_ex(auStack_88,auStack_80,thread_check_stack);
    lStack_90 = (long)iVar2;
    uStack_98 = 0;
    if (lStack_90 != 0) goto LAB_001d32f4;
    apcStack_a8[0] = (code *)0x1d30c3;
    iVar2 = uv_thread_join(auStack_88);
    lStack_90 = (long)iVar2;
    uStack_98 = 0;
    if (lStack_90 != 0) goto LAB_001d3303;
    lStack_78 = 0x2a;
    apcStack_a8[0] = (code *)0x1d3104;
    iVar2 = uv_thread_create_ex(auStack_88,auStack_80,thread_check_stack);
    lStack_90 = (long)iVar2;
    uStack_98 = 0;
    if (lStack_90 != 0) goto LAB_001d3312;
    apcStack_a8[0] = (code *)0x1d312e;
    iVar2 = uv_thread_join(auStack_88);
    lStack_90 = (long)iVar2;
    uStack_98 = 0;
    if (lStack_90 != 0) goto LAB_001d3321;
    apcStack_a8[0] = (code *)0x1d3158;
    lStack_78 = __sysconf(0x4b);
    lStack_78 = lStack_78 + -0x2a;
    apcStack_a8[0] = (code *)0x1d3179;
    iVar2 = uv_thread_create_ex(auStack_88,auStack_80,thread_check_stack);
    lStack_90 = (long)iVar2;
    uStack_98 = 0;
    if (lStack_90 != 0) goto LAB_001d3330;
    apcStack_a8[0] = (code *)0x1d31a3;
    iVar2 = uv_thread_join(auStack_88);
    lStack_90 = (long)iVar2;
    uStack_98 = 0;
    if (lStack_90 != 0) goto LAB_001d333f;
    apcStack_a8[0] = (code *)0x1d31cd;
    lVar3 = __sysconf(0x4b);
    lStack_78 = lVar3 / 2 + -0x2a;
    apcStack_a8[0] = (code *)0x1d31fb;
    iVar2 = uv_thread_create_ex(auStack_88,auStack_80,thread_check_stack);
    lStack_90 = (long)iVar2;
    uStack_98 = 0;
    if (lStack_90 != 0) goto LAB_001d334e;
    apcStack_a8[0] = (code *)0x1d3225;
    iVar2 = uv_thread_join(auStack_88);
    lStack_90 = (long)iVar2;
    uStack_98 = 0;
    if (lStack_90 != 0) goto LAB_001d335d;
    lStack_78 = 0x12d687;
    apcStack_a8[0] = (code *)0x1d3266;
    iVar2 = uv_thread_create_ex(auStack_88,auStack_80,thread_check_stack);
    lStack_90 = (long)iVar2;
    uStack_98 = 0;
    if (lStack_90 == 0) {
      apcStack_a8[0] = (code *)0x1d3290;
      iVar2 = uv_thread_join(auStack_88);
      lStack_90 = (long)iVar2;
      uStack_98 = 0;
      if (lStack_90 == 0) {
        return;
      }
      goto LAB_001d337b;
    }
  }
  else {
    apcStack_a8[0] = (code *)0x1d32c7;
    run_test_thread_stack_size_explicit_cold_1();
LAB_001d32c7:
    apcStack_a8[0] = (code *)0x1d32d6;
    run_test_thread_stack_size_explicit_cold_2();
LAB_001d32d6:
    apcStack_a8[0] = (code *)0x1d32e5;
    run_test_thread_stack_size_explicit_cold_3();
LAB_001d32e5:
    apcStack_a8[0] = (code *)0x1d32f4;
    run_test_thread_stack_size_explicit_cold_4();
LAB_001d32f4:
    apcStack_a8[0] = (code *)0x1d3303;
    run_test_thread_stack_size_explicit_cold_5();
LAB_001d3303:
    apcStack_a8[0] = (code *)0x1d3312;
    run_test_thread_stack_size_explicit_cold_6();
LAB_001d3312:
    apcStack_a8[0] = (code *)0x1d3321;
    run_test_thread_stack_size_explicit_cold_7();
LAB_001d3321:
    apcStack_a8[0] = (code *)0x1d3330;
    run_test_thread_stack_size_explicit_cold_8();
LAB_001d3330:
    apcStack_a8[0] = (code *)0x1d333f;
    run_test_thread_stack_size_explicit_cold_9();
LAB_001d333f:
    apcStack_a8[0] = (code *)0x1d334e;
    run_test_thread_stack_size_explicit_cold_10();
LAB_001d334e:
    apcStack_a8[0] = (code *)0x1d335d;
    run_test_thread_stack_size_explicit_cold_11();
LAB_001d335d:
    apcStack_a8[0] = (code *)0x1d336c;
    run_test_thread_stack_size_explicit_cold_12();
  }
  apcStack_a8[0] = (code *)0x1d337b;
  run_test_thread_stack_size_explicit_cold_13();
LAB_001d337b:
  plVar4 = &lStack_90;
  apcStack_a8[0] = getaddrinfo_do;
  run_test_thread_stack_size_explicit_cold_14();
  apcStack_c0[0] = (code *)0x1d33b2;
  iVar2 = uv_getaddrinfo(plVar4[2],plVar4 + 3,getaddrinfo_cb,"localhost",0,0);
  apcStack_a8[0] = (code *)(long)iVar2;
  uStack_b0 = 0;
  if (apcStack_a8[0] == (code *)0x0) {
    return;
  }
  ppcVar5 = apcStack_a8;
  apcStack_c0[0] = fs_do;
  getaddrinfo_do_cold_1();
  pcStack_d8 = (code *)0x1d3404;
  iVar2 = uv_fs_stat(ppcVar5[2],ppcVar5 + 3,".",fs_cb);
  apcStack_c0[0] = (code *)(long)iVar2;
  uStack_c8 = 0;
  if (apcStack_c0[0] == (code *)0x0) {
    return;
  }
  ppcVar5 = apcStack_c0;
  iVar2 = (int)&uStack_c8;
  pcStack_d8 = getaddrinfo_cb;
  fs_do_cold_1();
  lStack_e0 = (long)iVar2;
  pcStack_d8 = (code *)arg;
  if (lStack_e0 != 0) {
    plVar6 = &lStack_e0;
    getaddrinfo_cb_cold_1();
    uv_fs_req_cleanup();
    plVar4 = plVar6 + -2;
    *(int *)plVar4 = (int)*plVar4 + -1;
    if ((int)*plVar4 != 0) {
      fs_do((fs_req *)(plVar6 + -3));
      return;
    }
    return;
  }
  uv_freeaddrinfo(extraout_RDX);
  ppcVar1 = ppcVar5 + -2;
  *(int *)ppcVar1 = *(int *)ppcVar1 + -1;
  if (*(int *)ppcVar1 != 0) {
    getaddrinfo_do((getaddrinfo_req *)(ppcVar5 + -3));
    return;
  }
  return;
}

Assistant:

static void thread_check_stack(void* arg) {
#if defined(__APPLE__)
  size_t expected;
  expected = arg == NULL ? 0 : ((uv_thread_options_t*)arg)->stack_size;
  /* 512 kB is the default stack size of threads other than the main thread
   * on MacOS. */
  if (expected == 0)
    expected = 512 * 1024;
  ASSERT_GE(pthread_get_stacksize_np(pthread_self()), expected);
#elif defined(__linux__) && defined(__GLIBC__)
  size_t expected;
  struct rlimit lim;
  size_t stack_size;
  pthread_attr_t attr;
  ASSERT_OK(getrlimit(RLIMIT_STACK, &lim));
  if (lim.rlim_cur == RLIM_INFINITY)
    lim.rlim_cur = 2 << 20;  /* glibc default. */
  ASSERT_OK(pthread_getattr_np(pthread_self(), &attr));
  ASSERT_OK(pthread_attr_getstacksize(&attr, &stack_size));
  expected = arg == NULL ? 0 : ((uv_thread_options_t*)arg)->stack_size;
  if (expected == 0)
    expected = (size_t)lim.rlim_cur;
  ASSERT_GE(stack_size, expected);
  ASSERT_OK(pthread_attr_destroy(&attr));
#endif
}